

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawFile.cpp
# Opt level: O3

void __thiscall RawFile::write<unsigned_int>(RawFile *this,uint *buf,size_t count)

{
  ssize_t sVar1;
  runtime_error *this_00;
  size_t __n;
  
  __n = count << 2;
  while( true ) {
    if (__n == 0) {
      return;
    }
    sVar1 = write(this->fd,buf,__n);
    if (sVar1 < 0) break;
    buf = (uint *)((long)buf + sVar1);
    __n = __n - sVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"RawFile::write: write failed");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void RawFile::write(const T *buf, size_t count) {
    const auto *buf_raw = reinterpret_cast<const char *>(buf);
    uint64_t to_write = count * sizeof(T);
    while (to_write > 0) {
        ssize_t result = ::write(fd, buf_raw, to_write);
        if (result < 0) {
            throw std::runtime_error("RawFile::write: write failed");
        }
        buf_raw += result;
        to_write -= result;
    }
}